

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,
                   SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  Inst *pIVar1;
  iterator iVar2;
  bool bVar3;
  pointer pIVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint i;
  iterator iVar8;
  int *piVar9;
  uint local_4c;
  SparseArray<int> *local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_3c;
  Prog *local_38;
  
  reachable->size_ = 0;
  piVar5 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar8._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar8._M_current != piVar5) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar5;
    iVar8._M_current = piVar5;
  }
  local_4c = root;
  local_48 = rootmap;
  local_38 = this;
  if (iVar8._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar8,(int *)&local_4c);
    piVar5 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  else {
    *iVar8._M_current = root;
    piVar9 = iVar8._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar9;
  }
  if (piVar5 != piVar9) {
    do {
      i = piVar9[-1];
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = piVar9 + -1;
      while( true ) {
        bVar3 = SparseSetT<void>::contains(reachable,i);
        if (bVar3) break;
        SparseSetT<void>::InsertInternal(reachable,false,i);
        if (i != local_4c) {
          bVar3 = SparseArray<int>::has_index(local_48,i);
          if (bVar3) {
            iVar2._M_current =
                 (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                        (flat,iVar2);
              pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (iVar2._M_current)->out_opcode_ = 0;
              (iVar2._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
              pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_finish = pIVar4;
            }
            pIVar4[-1].out_opcode_ = pIVar4[-1].out_opcode_ & 0xfffffff8 | 6;
            piVar5 = SparseArray<int>::get_existing(local_48,i);
            pIVar4[-1].out_opcode_ = pIVar4[-1].out_opcode_ & 0xf | *piVar5 << 4;
            break;
          }
        }
        pIVar1 = (local_38->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar7 = pIVar1[(int)i].out_opcode_;
        switch(uVar7 & 7) {
        case 1:
          iVar2._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar2);
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar2._M_current)->out_opcode_ = 0;
            (iVar2._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish + 1;
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_finish = pIVar4;
          }
          iVar6 = (int)((ulong)((long)pIVar4 -
                               (long)(flat->
                                     super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
          pIVar4[-1].out_opcode_ = (pIVar4[-1].out_opcode_ & 8) + iVar6 * 0x10 + 1;
          pIVar4[-1].field_1.out1_ = iVar6 + 1;
          uVar7 = pIVar1[(int)i].out_opcode_;
        case 0:
          if ((uVar7 & 6) != 0) {
            __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                          ,0x55,"int re2::Prog::Inst::out1()");
          }
          local_3c = pIVar1[(int)i].field_1;
          iVar8._M_current =
               (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar8._M_current ==
              (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar8,&local_3c.cap_)
            ;
          }
          else {
            *iVar8._M_current = (int)local_3c;
            (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar8._M_current + 1;
          }
          uVar7 = pIVar1[(int)i].out_opcode_;
        case 6:
          i = uVar7 >> 4;
          break;
        default:
          iVar2._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar2);
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar2._M_current)->out_opcode_ = 0;
            (iVar2._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish + 1;
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_finish = pIVar4;
          }
          pIVar4[-1] = pIVar1[(int)i];
          pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          piVar5 = SparseArray<int>::get_existing(local_48,pIVar1[(int)i].out_opcode_ >> 4);
          pIVar4[-1].out_opcode_ = pIVar4[-1].out_opcode_ & 0xf | *piVar5 << 4;
          goto LAB_00257f7a;
        case 5:
        case 7:
          iVar2._M_current =
               (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::_M_realloc_insert<>
                      (flat,iVar2);
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (iVar2._M_current)->out_opcode_ = 0;
            (iVar2._M_current)->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
            pIVar4 = (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>).
                     _M_impl.super__Vector_impl_data._M_finish + 1;
            (flat->super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>)._M_impl.
            super__Vector_impl_data._M_finish = pIVar4;
          }
          pIVar4[-1] = pIVar1[(int)i];
          goto LAB_00257f7a;
        }
      }
LAB_00257f7a:
      piVar9 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar9);
  }
  return;
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}